

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition.hxx
# Opt level: O2

void __thiscall
andres::Partition<unsigned_long>::merge
          (Partition<unsigned_long> *this,Index element1,Index element2)

{
  pointer puVar1;
  Index IVar2;
  Index IVar3;
  
  IVar2 = find(this,element1);
  IVar3 = find(this,element2);
  puVar1 = (this->ranks_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1[IVar2] < puVar1[IVar3]) {
    (this->parents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[IVar2] = IVar3;
  }
  else if (puVar1[IVar3] < puVar1[IVar2]) {
    (this->parents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[IVar3] = IVar2;
  }
  else {
    if (IVar2 == IVar3) {
      return;
    }
    (this->parents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[IVar3] = IVar2;
    puVar1[IVar2] = puVar1[IVar2] + 1;
  }
  this->numberOfSets_ = this->numberOfSets_ - 1;
  return;
}

Assistant:

inline void 
Partition<T>::merge(
    Index element1,
    Index element2
) {
    // merge by rank
    element1 = find(element1);
    element2 = find(element2);
    if(ranks_[static_cast<std::size_t>(element1)] < ranks_[static_cast<std::size_t>(element2)]) {
        parents_[static_cast<std::size_t>(element1)] = element2;
        --numberOfSets_;
    }
    else if(ranks_[static_cast<std::size_t>(element1)] > ranks_[static_cast<std::size_t>(element2)]) {
        parents_[static_cast<std::size_t>(element2)] = element1;
        --numberOfSets_;
    }
    else if(element1 != element2) {
        parents_[static_cast<std::size_t>(element2)] = element1;
        ++ranks_[static_cast<std::size_t>(element1)];
        --numberOfSets_;
    }
}